

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_history.cpp
# Opt level: O0

UndoState * __thiscall
undo::UndoHistory::findCommonParent(UndoHistory *this,UndoState *a,UndoState *b)

{
  UndoState *local_38;
  UndoState *pB;
  UndoState *pA;
  UndoState *b_local;
  UndoState *a_local;
  UndoHistory *this_local;
  
  if ((a != (UndoState *)0x0) && (local_38 = b, pB = a, b != (UndoState *)0x0)) {
    do {
      if (pB == local_38) {
        return pB;
      }
      pB = pB->m_parent;
    } while ((pB != (UndoState *)0x0) ||
            (local_38 = local_38->m_parent, pB = a, local_38 != (UndoState *)0x0));
  }
  return (UndoState *)0x0;
}

Assistant:

const UndoState* UndoHistory::findCommonParent(const UndoState* a,
                                               const UndoState* b)
{
  const UndoState* pA = a;
  const UndoState* pB = b;

  if (pA == nullptr || pB == nullptr)
    return nullptr;

  while (pA != pB) {
    pA = pA->m_parent;
    if (!pA) {
      pA = a;
      pB = pB->m_parent;
      if (!pB)
        return nullptr;
    }
  }

  return pA;
}